

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::posix_part_file::move_partfile(posix_part_file *this,string *path,error_code *ec)

{
  error_code eVar1;
  bool bVar2;
  char *in_R9;
  string_view lhs;
  string_view lhs_00;
  string_view rhs;
  string_view rhs_00;
  string old_path;
  string new_path;
  storage_error se;
  
  flush_metadata_impl(this,ec);
  if (ec->failed_ == false) {
    if ((this->m_piece_map)._M_h._M_element_count != 0) {
      lhs._M_str = (char *)(this->m_name)._M_string_length;
      lhs._M_len = (size_t)(this->m_path)._M_dataplus._M_p;
      rhs._M_str = in_R9;
      rhs._M_len = (size_t)(this->m_name)._M_dataplus._M_p;
      combine_path_abi_cxx11_(&old_path,(libtorrent *)(this->m_path)._M_string_length,lhs,rhs);
      lhs_00._M_str = (char *)(this->m_name)._M_string_length;
      lhs_00._M_len = (size_t)(path->_M_dataplus)._M_p;
      rhs_00._M_str = in_R9;
      rhs_00._M_len = (size_t)(this->m_name)._M_dataplus._M_p;
      combine_path_abi_cxx11_(&new_path,(libtorrent *)path->_M_string_length,lhs_00,rhs_00);
      rename((libtorrent *)&old_path,(char *)&new_path,(char *)ec);
      se.ec = (error_code)boost::system::errc::make_error_condition(no_such_file_or_directory);
      bVar2 = boost::system::operator==(ec,(error_condition *)&se);
      if (bVar2) {
        ec->val_ = 0;
        ec->failed_ = false;
        ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                    super_error_category;
      }
      else if ((ec->failed_ & 1U) != 0) {
        se.ec._0_8_ = se.ec._5_8_ << 0x28;
        se.ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                      super_error_category;
        se._16_3_ = 0xffffff;
        se.operation = unknown;
        copy_file(&old_path,&new_path,&se);
        eVar1 = se.ec;
        ec->val_ = se.ec.val_;
        ec->failed_ = se.ec.failed_;
        *(undefined3 *)&ec->field_0x5 = se.ec._5_3_;
        ec->cat_ = se.ec.cat_;
        se.ec = eVar1;
        if (ec->failed_ != false) {
          ::std::__cxx11::string::~string((string *)&new_path);
          ::std::__cxx11::string::~string((string *)&old_path);
          return;
        }
        remove((libtorrent *)&old_path,(char *)ec);
      }
      ::std::__cxx11::string::~string((string *)&new_path);
      ::std::__cxx11::string::~string((string *)&old_path);
    }
    ::std::__cxx11::string::_M_assign((string *)this);
  }
  return;
}

Assistant:

void posix_part_file::move_partfile(std::string const& path, error_code& ec)
	{
		flush_metadata_impl(ec);
		if (ec) return;

		if (!m_piece_map.empty())
		{
			std::string old_path = combine_path(m_path, m_name);
			std::string new_path = combine_path(path, m_name);

			rename(old_path, new_path, ec);
			if (ec == boost::system::errc::no_such_file_or_directory)
				ec.clear();

			if (ec)
			{
				storage_error se;
				aux::copy_file(old_path, new_path, se);
				ec = se.ec;
				if (ec) return;
				remove(old_path, ec);
			}
		}
		m_path = path;
	}